

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall dynet::RMSPropTrainer::restart(RMSPropTrainer *this)

{
  bool bVar1;
  reference __src;
  long in_RDI;
  ShadowLookupParameters slp;
  iterator __end1_1;
  iterator __begin1_1;
  vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_> *__range1_1;
  ShadowParameters sp;
  iterator __end1;
  iterator __begin1;
  vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *__range1;
  ShadowLookupParameters *in_stack_ffffffffffffff08;
  ShadowLookupParameters *in_stack_ffffffffffffff10;
  ShadowLookupParameters local_d0;
  ShadowLookupParameters *local_78;
  __normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
  local_70;
  long local_68;
  undefined1 local_60 [64];
  ShadowParameters *local_20;
  __normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
  local_18;
  long local_10;
  
  local_10 = in_RDI + 0x38;
  local_18._M_current =
       (ShadowParameters *)
       std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::begin
                 ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *)
                  in_stack_ffffffffffffff08);
  local_20 = (ShadowParameters *)
             std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>::end
                       ((vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_> *
                        )in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    __src = __gnu_cxx::
            __normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
            ::operator*(&local_18);
    memcpy(local_60,__src,0x40);
    TensorTools::zero((Tensor *)0xdb3c9c);
    __gnu_cxx::
    __normal_iterator<dynet::ShadowParameters_*,_std::vector<dynet::ShadowParameters,_std::allocator<dynet::ShadowParameters>_>_>
    ::operator++(&local_18);
  }
  local_68 = in_RDI + 0x50;
  local_70._M_current =
       (ShadowLookupParameters *)
       std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
       begin(in_stack_ffffffffffffff08);
  local_78 = (ShadowLookupParameters *)
             std::
             vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>::
             end((vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
                  *)in_stack_ffffffffffffff08);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
                        *)in_stack_ffffffffffffff10,
                       (__normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
                        *)in_stack_ffffffffffffff08);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
    ::operator*(&local_70);
    in_stack_ffffffffffffff10 = &local_d0;
    ShadowLookupParameters::ShadowLookupParameters
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    TensorTools::zero((Tensor *)0xdb3d2a);
    ShadowLookupParameters::~ShadowLookupParameters((ShadowLookupParameters *)0xdb3d36);
    __gnu_cxx::
    __normal_iterator<dynet::ShadowLookupParameters_*,_std::vector<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>_>
    ::operator++(&local_70);
  }
  return;
}

Assistant:

void RMSPropTrainer::restart() {
  for (auto sp : hmsg)
    TensorTools::zero(sp.h);
  for (auto slp : hlmsg)
    TensorTools::zero(slp.all_h);
}